

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

RowSet * sqlite3RowSetInit(sqlite3 *db)

{
  undefined1 auVar1 [16];
  int iVar2;
  RowSet *p_00;
  int N;
  RowSet *p;
  sqlite3 *db_local;
  
  p_00 = (RowSet *)sqlite3DbMallocRawNN(db,0x38);
  if (p_00 != (RowSet *)0x0) {
    iVar2 = sqlite3DbMallocSize(db,p_00);
    p_00->pChunk = (RowSetChunk *)0x0;
    p_00->db = db;
    p_00->pEntry = (RowSetEntry *)0x0;
    p_00->pLast = (RowSetEntry *)0x0;
    p_00->pForest = (RowSetEntry *)0x0;
    p_00->pFresh = (RowSetEntry *)(p_00 + 1);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)iVar2 - 0x38;
    p_00->nFresh = SUB162(auVar1 / ZEXT816(0x18),0);
    p_00->rsFlags = 1;
    p_00->iBatch = 0;
  }
  return p_00;
}

Assistant:

SQLITE_PRIVATE RowSet *sqlite3RowSetInit(sqlite3 *db){
  RowSet *p = sqlite3DbMallocRawNN(db, sizeof(*p));
  if( p ){
    int N = sqlite3DbMallocSize(db, p);
    p->pChunk = 0;
    p->db = db;
    p->pEntry = 0;
    p->pLast = 0;
    p->pForest = 0;
    p->pFresh = (struct RowSetEntry*)(ROUND8(sizeof(*p)) + (char*)p);
    p->nFresh = (u16)((N - ROUND8(sizeof(*p)))/sizeof(struct RowSetEntry));
    p->rsFlags = ROWSET_SORTED;
    p->iBatch = 0;
  }
  return p;
}